

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

size_t fileTell(file_t file)

{
  FILE *in_RDI;
  long pos;
  undefined8 local_8;
  
  local_8 = ftell(in_RDI);
  if (local_8 == 0xffffffffffffffff) {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t fileTell(file_t file)
{
	long pos;
	ASSERT(fileIsValid(file));
	pos = ftell(file);
	if (pos == -1L || (long)(size_t)pos != pos)
		return SIZE_MAX;
	return (size_t)pos;
}